

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O2

size_t pstore::utf::length(czstring str)

{
  size_t sVar1;
  size_t sVar2;
  
  if (str != (czstring)0x0) {
    sVar1 = strlen(str);
    sVar2 = length<char_const*>(str,str + sVar1);
    return sVar2;
  }
  return 0;
}

Assistant:

auto length (gsl::czstring const str) -> std::size_t {
            return str == nullptr ? 0 : length (str, str + std::strlen (str));
        }